

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O1

bool __thiscall
DynamicProfileStorageReaderWriter::Init
          (DynamicProfileStorageReaderWriter *this,char16 *filename,char16 *mode,
          bool deleteNonClosed,errno_t *err)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PAL_FILE *pPVar4;
  
  if (this->file != (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x45,"(file == nullptr)","file == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pPVar4 = _wfopen(filename,mode);
  if (pPVar4 != (PAL_FILE *)0x0) {
    this->file = pPVar4;
  }
  if (pPVar4 == (PAL_FILE *)0x0) {
    if (err != (errno_t *)0x0) {
      *err = (uint)(pPVar4 == (PAL_FILE *)0x0);
    }
  }
  else {
    this->filename = filename;
    this->deleteNonClosed = deleteNonClosed;
  }
  return pPVar4 != (PAL_FILE *)0x0;
}

Assistant:

bool DynamicProfileStorageReaderWriter::Init(char16 const * filename, char16 const * mode, bool deleteNonClosed, errno_t * err = nullptr)
{
    AssertOrFailFast(file == nullptr);
    errno_t e = _wfopen_s(&file, filename, mode);
    if (e != 0)
    {
        if (err)
        {
            *err = e;
        }
        return false;
    }
    this->filename = filename;
    this->deleteNonClosed = deleteNonClosed;
    return true;
}